

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

DBErrors __thiscall wallet::CWallet::ReorderTransactions(CWallet *this)

{
  int64_t *__x;
  _Rb_tree_header *p_Var1;
  long lVar2;
  CWalletTx *wtx;
  bool bVar3;
  WalletDatabase *pWVar4;
  long lVar5;
  _Base_ptr p_Var6;
  long lVar7;
  int64_t *nOffsetStart;
  pointer plVar8;
  __node_base *p_Var9;
  long in_FS_OFFSET;
  DBErrors local_ac;
  vector<long,_std::allocator<long>_> nOrderPosOffsets;
  WalletBatch local_88;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  TxItems txByTime;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x38d,false);
  pWVar4 = GetDatabase(this);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_88,pWVar4,1);
  p_Var1 = &txByTime._M_t._M_impl.super__Rb_tree_header;
  txByTime._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  txByTime._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  txByTime._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = &(this->mapWallet)._M_h._M_before_begin;
  local_88.m_database = pWVar4;
  txByTime._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  txByTime._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)(p_Var9 + 5);
    nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)CONCAT44(nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  *(undefined4 *)((long)&p_Var9[0xe]._M_nxt + 4));
    std::
    _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
    ::_M_emplace_equal<std::pair<unsigned_int,wallet::CWalletTx*>>
              ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                *)&txByTime,(pair<unsigned_int,_wallet::CWalletTx_*> *)&nOrderPosOffsets);
  }
  this->nOrderPosNext = 0;
  nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_ac = LOAD_FAIL;
  for (p_Var6 = txByTime._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    wtx = (CWalletTx *)p_Var6[1]._M_parent;
    __x = &wtx->nOrderPos;
    lVar5 = wtx->nOrderPos;
    if (lVar5 == -1) {
      lVar5 = this->nOrderPosNext;
      this->nOrderPosNext = lVar5 + 1;
      *__x = lVar5;
      ::_GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&nOrderPosOffsets,__x);
      bVar3 = WalletBatch::WriteTx(&local_88,wtx);
LAB_009a0377:
      if (bVar3 == false) goto LAB_009a03a4;
    }
    else {
      lVar7 = 0;
      for (plVar8 = nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          plVar8 != nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish; plVar8 = plVar8 + 1) {
        lVar7 = lVar7 + (ulong)(*plVar8 <= lVar5);
      }
      *__x = lVar7 + lVar5;
      lVar5 = lVar5 + lVar7 + 1;
      if (lVar5 < this->nOrderPosNext) {
        lVar5 = this->nOrderPosNext;
      }
      this->nOrderPosNext = lVar5;
      if (lVar7 != 0) {
        bVar3 = WalletBatch::WriteTx(&local_88,wtx);
        goto LAB_009a0377;
      }
    }
  }
  local_ac = LOAD_OK;
  WalletBatch::WriteOrderPosNext(&local_88,this->nOrderPosNext);
LAB_009a03a4:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&nOrderPosOffsets.super__Vector_base<long,_std::allocator<long>_>);
  std::
  _Rb_tree<long,_std::pair<const_long,_wallet::CWalletTx_*>,_std::_Select1st<std::pair<const_long,_wallet::CWalletTx_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  ::~_Rb_tree(&txByTime._M_t);
  if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
      local_88.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_88.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_ac;
  }
  __stack_chk_fail();
}

Assistant:

DBErrors CWallet::ReorderTransactions()
{
    LOCK(cs_wallet);
    WalletBatch batch(GetDatabase());

    // Old wallets didn't have any defined order for transactions
    // Probably a bad idea to change the output of this

    // First: get all CWalletTx into a sorted-by-time multimap.
    typedef std::multimap<int64_t, CWalletTx*> TxItems;
    TxItems txByTime;

    for (auto& entry : mapWallet)
    {
        CWalletTx* wtx = &entry.second;
        txByTime.insert(std::make_pair(wtx->nTimeReceived, wtx));
    }

    nOrderPosNext = 0;
    std::vector<int64_t> nOrderPosOffsets;
    for (TxItems::iterator it = txByTime.begin(); it != txByTime.end(); ++it)
    {
        CWalletTx *const pwtx = (*it).second;
        int64_t& nOrderPos = pwtx->nOrderPos;

        if (nOrderPos == -1)
        {
            nOrderPos = nOrderPosNext++;
            nOrderPosOffsets.push_back(nOrderPos);

            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
        else
        {
            int64_t nOrderPosOff = 0;
            for (const int64_t& nOffsetStart : nOrderPosOffsets)
            {
                if (nOrderPos >= nOffsetStart)
                    ++nOrderPosOff;
            }
            nOrderPos += nOrderPosOff;
            nOrderPosNext = std::max(nOrderPosNext, nOrderPos + 1);

            if (!nOrderPosOff)
                continue;

            // Since we're changing the order, write it back
            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
    }
    batch.WriteOrderPosNext(nOrderPosNext);

    return DBErrors::LOAD_OK;
}